

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

void duckdb::BitStringFunction<true>(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  int *piVar5;
  reference vector;
  reference vector_00;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  data_ptr_t pdVar12;
  long lVar13;
  idx_t iVar14;
  ulong uVar15;
  ValidityMask *in_R8;
  idx_t in_R9;
  data_ptr_t pdVar16;
  ulong uVar17;
  data_ptr_t pdVar18;
  ulong uVar19;
  bool bVar20;
  anon_struct_16_3_d7536bce_for_pointer aVar21;
  string_t sVar22;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  idx_t local_d8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar4 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      aVar21 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          *(int *)vector_00->data,in_R8,in_R9);
      paVar4->pointer = aVar21;
      return;
    }
  }
  else {
    local_d8 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar18 = vector->data;
      piVar5 = (int *)vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar16 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar13 = 8;
          while (bVar20 = local_d8 != 0, local_d8 = local_d8 - 1, bVar20) {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + lVar13);
            left_02.value._0_8_ = *(undefined8 *)(pdVar18 + lVar13 + -8);
            sVar22 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,*piVar5,in_R8,in_R9);
            *(long *)(pdVar16 + lVar13 + -8) = sVar22.value._0_8_;
            *(long *)(pdVar16 + lVar13) = sVar22.value._8_8_;
            lVar13 = lVar13 + 0x10;
          }
          return;
        }
        uVar8 = 0;
        uVar19 = 0;
        do {
          if (uVar8 == local_d8 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar17 = uVar19 + 0x40;
            if (local_d8 <= uVar19 + 0x40) {
              uVar17 = local_d8;
            }
LAB_00c4220c:
            uVar10 = uVar19 << 4 | 8;
            for (; uVar7 = uVar19, uVar19 < uVar17; uVar19 = uVar19 + 1) {
              left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + uVar10);
              left.value._0_8_ = *(undefined8 *)(pdVar18 + (uVar10 - 8));
              sVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left,*piVar5,in_R8,in_R9);
              *(long *)(pdVar16 + (uVar10 - 8)) = sVar22.value._0_8_;
              *(long *)(pdVar16 + uVar10) = sVar22.value._8_8_;
              uVar10 = uVar10 + 0x10;
            }
          }
          else {
            uVar10 = puVar3[uVar8];
            uVar17 = uVar19 + 0x40;
            if (local_d8 <= uVar19 + 0x40) {
              uVar17 = local_d8;
            }
            if (uVar10 == 0xffffffffffffffff) goto LAB_00c4220c;
            uVar7 = uVar17;
            if (uVar10 != 0) {
              uVar15 = uVar19 << 4 | 8;
              for (uVar11 = 0; uVar7 = uVar19 + uVar11, uVar19 + uVar11 < uVar17;
                  uVar11 = uVar11 + 1) {
                if ((uVar10 >> (uVar11 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + uVar15);
                  left_00.value._0_8_ = *(undefined8 *)(pdVar18 + (uVar15 - 8));
                  sVar22 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,*piVar5,in_R8,in_R9);
                  *(long *)(pdVar16 + (uVar15 - 8)) = sVar22.value._0_8_;
                  *(long *)(pdVar16 + uVar15) = sVar22.value._8_8_;
                }
                uVar15 = uVar15 + 0x10;
              }
            }
          }
          uVar8 = uVar8 + 1;
          uVar19 = uVar7;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar18 = vector->data;
          pdVar16 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,local_d8);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar13 = 0;
            while (bVar20 = local_d8 != 0, local_d8 = local_d8 - 1, bVar20) {
              sVar22.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + lVar13 * 4 + 8);
              sVar22.value._0_8_ = *(undefined8 *)(pdVar18 + lVar13 * 4);
              sVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar22,*(int *)(pdVar16 + lVar13),
                                  in_R8,in_R9);
              *(long *)(pdVar12 + lVar13 * 4) = sVar22.value._0_8_;
              *(long *)(pdVar12 + lVar13 * 4 + 8) = sVar22.value._8_8_;
              lVar13 = lVar13 + 4;
            }
          }
          else {
            uVar19 = 0;
            for (uVar8 = 0; uVar8 != local_d8 + 0x3f >> 6; uVar8 = uVar8 + 1) {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar17 = uVar19 + 0x40;
                if (local_d8 <= uVar19 + 0x40) {
                  uVar17 = local_d8;
                }
LAB_00c42684:
                uVar10 = uVar19 << 4 | 8;
                for (; uVar7 = uVar19, uVar19 < uVar17; uVar19 = uVar19 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + uVar10);
                  left_03.value._0_8_ = *(undefined8 *)(pdVar18 + (uVar10 - 8));
                  sVar22 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,
                                      *(int *)(pdVar16 + uVar19 * 4),in_R8,in_R9);
                  *(long *)(pdVar12 + (uVar10 - 8)) = sVar22.value._0_8_;
                  *(long *)(pdVar12 + uVar10) = sVar22.value._8_8_;
                  uVar10 = uVar10 + 0x10;
                }
              }
              else {
                uVar10 = puVar3[uVar8];
                uVar17 = uVar19 + 0x40;
                if (local_d8 <= uVar19 + 0x40) {
                  uVar17 = local_d8;
                }
                if (uVar10 == 0xffffffffffffffff) goto LAB_00c42684;
                uVar7 = uVar17;
                if (uVar10 != 0) {
                  uVar11 = uVar19 << 4 | 8;
                  for (uVar15 = 0; uVar7 = uVar15 + uVar19, uVar15 + uVar19 < uVar17;
                      uVar15 = uVar15 + 1) {
                    if ((uVar10 >> (uVar15 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar18 + uVar11);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar18 + (uVar11 - 8));
                      sVar22 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,
                                          *(int *)(pdVar16 + uVar15 * 4 + uVar19 * 4),in_R8,in_R9);
                      *(long *)(pdVar12 + (uVar11 - 8)) = sVar22.value._0_8_;
                      *(long *)(pdVar12 + uVar11) = sVar22.value._8_8_;
                    }
                    uVar11 = uVar11 + 0x10;
                  }
                }
              }
              uVar19 = uVar7;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,local_d8,&ldata);
          Vector::ToUnifiedFormat(vector_00,local_d8,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar18 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            pdVar18 = pdVar18 + 8;
            for (iVar14 = 0; local_d8 != iVar14; iVar14 = iVar14 + 1) {
              iVar6 = iVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(ldata.sel)->sel_vector[iVar14];
              }
              iVar9 = iVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
              }
              left_01.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar6 * 0x10 + 8);
              left_01.value._0_8_ = *(undefined8 *)(ldata.data + iVar6 * 0x10);
              sVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,
                                  *(int *)(local_c0.data + iVar9 * 4),in_R8,in_R9);
              *(long *)(pdVar18 + -8) = sVar22.value._0_8_;
              *(long *)pdVar18 = sVar22.value._8_8_;
              pdVar18 = pdVar18 + 0x10;
            }
          }
          else {
            pdVar18 = pdVar18 + 8;
            for (iVar14 = 0; local_d8 != iVar14; iVar14 = iVar14 + 1) {
              iVar6 = iVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar6 = (idx_t)(ldata.sel)->sel_vector[iVar14];
              }
              iVar9 = iVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar6 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(ldata.data + iVar6 * 0x10);
                sVar22 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(int *)(local_c0.data + iVar9 * 4),in_R8,in_R9);
                *(long *)(pdVar18 + -8) = sVar22.value._0_8_;
                *(long *)pdVar18 = sVar22.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
              }
              pdVar18 = pdVar18 + 0x10;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar18 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar16 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar16 = pdVar16 + 8;
          for (iVar14 = 0; local_d8 != iVar14; iVar14 = iVar14 + 1) {
            sVar22 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                *(int *)(pdVar18 + iVar14 * 4),in_R8,in_R9);
            *(long *)(pdVar16 + -8) = sVar22.value._0_8_;
            *(long *)pdVar16 = sVar22.value._8_8_;
            pdVar16 = pdVar16 + 0x10;
          }
          return;
        }
        uVar8 = 0;
        uVar19 = 0;
        do {
          if (uVar8 == local_d8 + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar17 = uVar19 + 0x40;
            if (local_d8 <= uVar19 + 0x40) {
              uVar17 = local_d8;
            }
LAB_00c424ba:
            pdVar12 = pdVar16 + uVar19 * 0x10 + 8;
            for (; uVar7 = uVar19, uVar19 < uVar17; uVar19 = uVar19 + 1) {
              sVar22 = BinaryLambdaWrapper::
                       Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                  *(int *)(pdVar18 + uVar19 * 4),in_R8,in_R9);
              *(long *)(pdVar12 + -8) = sVar22.value._0_8_;
              *(long *)pdVar12 = sVar22.value._8_8_;
              pdVar12 = pdVar12 + 0x10;
            }
          }
          else {
            uVar10 = puVar3[uVar8];
            uVar17 = uVar19 + 0x40;
            if (local_d8 <= uVar19 + 0x40) {
              uVar17 = local_d8;
            }
            if (uVar10 == 0xffffffffffffffff) goto LAB_00c424ba;
            uVar7 = uVar17;
            if (uVar10 != 0) {
              pdVar12 = pdVar16 + uVar19 * 0x10 + 8;
              for (uVar11 = 0; uVar7 = uVar19 + uVar11, uVar19 + uVar11 < uVar17;
                  uVar11 = uVar11 + 1) {
                if ((uVar10 >> (uVar11 & 0x3f) & 1) != 0) {
                  sVar22 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar4->pointer,
                                      *(int *)(pdVar18 + uVar11 * 4 + uVar19 * 4),in_R8,in_R9);
                  *(long *)(pdVar12 + -8) = sVar22.value._0_8_;
                  *(long *)pdVar12 = sVar22.value._8_8_;
                }
                pdVar12 = pdVar12 + 0x10;
              }
            }
          }
          uVar8 = uVar8 + 1;
          uVar19 = uVar7;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitStringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, int32_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t input, int32_t n) {
		    if (n < 0) {
			    throw InvalidInputException("The bitstring length cannot be negative");
		    }
		    idx_t input_length;
		    if (FROM_STRING) {
			    input_length = input.GetSize();
		    } else {
			    input_length = Bit::BitLength(input);
		    }
		    if (idx_t(n) < input_length) {
			    throw InvalidInputException("Length must be equal or larger than input string");
		    }
		    idx_t len;
		    if (FROM_STRING) {
			    Bit::TryGetBitStringSize(input, len, nullptr); // string verification
		    }

		    len = Bit::ComputeBitstringLen(UnsafeNumericCast<idx_t>(n));
		    string_t target = StringVector::EmptyString(result, len);
		    if (FROM_STRING) {
			    Bit::BitString(input, UnsafeNumericCast<idx_t>(n), target);
		    } else {
			    Bit::ExtendBitString(input, UnsafeNumericCast<idx_t>(n), target);
		    }
		    target.Finalize();
		    return target;
	    });
}